

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O0

void xvec_insert(xvec_t *xv,size_t pos,void *pvalues,size_t count)

{
  size_t count_local;
  void *pvalues_local;
  size_t pos_local;
  xvec_t *xv_local;
  
  if (xv->capacity < xv->size + count) {
    capacity_expand(xv,count);
  }
  memmove(xv->data + xv->val_size * (pos + count),xv->data + xv->val_size * pos,
          xv->val_size * (xv->size - pos));
  if (pvalues != (void *)0x0) {
    memcpy(xv->data + xv->val_size * pos,pvalues,xv->val_size * count);
  }
  xv->size = count + xv->size;
  return;
}

Assistant:

void xvec_insert(xvec_t* xv,
        size_t pos, const void* pvalues, size_t count)
{
    if (need_expand(xv, count))
        capacity_expand(xv, count);

    /* >>> */
    memmove(xvec_at(xv, pos + count), xvec_at(xv, pos),
            xv->val_size * (xv->size - pos));

    if (pvalues)
        memcpy(xvec_at(xv, pos), pvalues,
                xv->val_size * count);

    xv->size += count;
}